

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int string_get_hex(JSString *p,int k,int n)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  
  lVar2 = (long)k;
  uVar1 = 0;
  do {
    if (n < 1) {
      return uVar1;
    }
    if ((p->field_0x7 & 0x80) == 0) {
      uVar3 = (uint)*(byte *)((long)&p[1].header.ref_count + lVar2);
    }
    else {
      uVar3 = (uint)*(ushort *)((long)&p[1].header.ref_count + lVar2 * 2);
    }
    uVar4 = uVar3 - 0x30;
    if (9 < uVar4) {
      if (uVar3 - 0x41 < 6) {
        uVar4 = uVar3 - 0x37;
      }
      else {
        if (uVar3 - 0x67 < 0xfffffffa) {
          return -1;
        }
        uVar4 = uVar3 - 0x57;
      }
    }
    lVar2 = lVar2 + 1;
    uVar1 = uVar1 << 4 | uVar4;
    n = n + -1;
  } while( true );
}

Assistant:

static int string_get_hex(JSString *p, int k, int n) {
    int c = 0, h;
    while (n-- > 0) {
        if ((h = from_hex(string_get(p, k++))) < 0)
            return -1;
        c = (c << 4) | h;
    }
    return c;
}